

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_ghost_hearing(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  long *local_20;
  ghost_level *l;
  ghost *g;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    for (local_20 = *(long **)((long)pvVar2 + 0x18); *local_20 != 0; local_20 = (long *)*local_20) {
    }
    wVar1 = parser_getint(p,"hearing");
    *(int *)((long)local_20 + 0x14) = (wVar1 * 0x14) / (int)(uint)z_info->max_sight;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x7c9,"enum parser_error parse_ghost_hearing(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_hearing(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->hearing = parser_getint(p, "hearing") * 20 / z_info->max_sight;
	return PARSE_ERROR_NONE;
}